

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
operator()(arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,void *value)

{
  char cVar1;
  
  if (((this->specs_ != (format_specs *)0x0) &&
      (cVar1 = (this->specs_->super_core_format_specs).type, cVar1 != '\0')) && (cVar1 != 'p')) {
    error_handler::on_error((error_handler *)this,"invalid type specifier");
  }
  write_pointer(this,value);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }